

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_mix_2_0_to_1_0(mixed_segment *segment)

{
  undefined8 *puVar1;
  uint32_t i;
  ulong uVar2;
  uint32_t frames;
  float *out;
  float *r;
  float *l;
  
  puVar1 = (undefined8 *)segment->data;
  frames = 0xffffffff;
  mixed_buffer_request_read(&l,&frames,(mixed_buffer *)*puVar1);
  mixed_buffer_request_read(&r,&frames,(mixed_buffer *)puVar1[1]);
  mixed_buffer_request_write(&out,&frames,(mixed_buffer *)puVar1[0xe]);
  for (uVar2 = 0; frames != uVar2; uVar2 = uVar2 + 1) {
    out[uVar2] = (l[uVar2] + r[uVar2]) * 0.5;
  }
  mixed_buffer_finish_read(frames,(mixed_buffer *)*puVar1);
  mixed_buffer_finish_read(frames,(mixed_buffer *)puVar1[1]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0xe]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_1_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict out;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&out, &frames, data->out[MIXED_MONO]);
  for(uint32_t i=0; i<frames; ++i){
    out[i] = (l[i]+r[i])*0.5;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_MONO]);
  
  return 1;
}